

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::AllocateMapValue
          (DynamicMapField *this,MapValueRef *map_val)

{
  int iVar1;
  undefined4 extraout_var;
  FieldDescriptor *field;
  Message *pMVar2;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Reflection *this_00;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  iVar1 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
  field = Descriptor::map_value((Descriptor *)CONCAT44(extraout_var,iVar1));
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_28,&local_30);
  }
  (map_val->super_MapValueConstRef).type_ =
       *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4);
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),&local_28,&local_30);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
  case 8:
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<int>((this->
                                super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                ).super_MapFieldBase.arena_);
    break;
  case 2:
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<long>((this->
                                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                 ).super_MapFieldBase.arena_);
    break;
  case 3:
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<unsigned_int>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case 4:
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<unsigned_long>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case 5:
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<double>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case 6:
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<float>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case 7:
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Arena::Create<bool>((this->
                                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                 ).super_MapFieldBase.arena_);
    break;
  case 9:
    pbVar3 = Arena::Create<std::__cxx11::string>
                       ((this->
                        super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                        ).super_MapFieldBase.arena_);
    break;
  case 10:
    (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x11])();
    pMVar2 = Reflection::GetMessage(this_00,this->default_entry_,field,(MessageFactory *)0x0);
    iVar1 = (*(pMVar2->super_MessageLite)._vptr_MessageLite[3])
                      (pMVar2,(this->
                              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                              ).super_MapFieldBase.arena_);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var_00,iVar1);
    break;
  default:
    goto switchD_003abd5a_default;
  }
  (map_val->super_MapValueConstRef).data_ = pbVar3;
switchD_003abd5a_default:
  return;
}

Assistant:

void DynamicMapField::AllocateMapValue(MapValueRef* map_val) {
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  map_val->SetType(val_des->cpp_type());
  // Allocate memory for the MapValueRef, and initialize to
  // default value.
  switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    map_val->SetValue(value);                                \
    break;                                                   \
  }
    HANDLE_TYPE(INT32, int32_t);
    HANDLE_TYPE(INT64, int64_t);
    HANDLE_TYPE(UINT32, uint32_t);
    HANDLE_TYPE(UINT64, uint64_t);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(STRING, std::string);
    HANDLE_TYPE(ENUM, int32_t);
#undef HANDLE_TYPE
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      const Message& message =
          default_entry_->GetReflection()->GetMessage(*default_entry_, val_des);
      Message* value = message.New(MapFieldBase::arena_);
      map_val->SetValue(value);
      break;
    }
  }
}